

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

int av1_check_fpmt_config(AV1_PRIMARY *ppi,AV1EncoderConfig *oxcf)

{
  size_t __n;
  byte bVar1;
  int iVar2;
  AV1_COMP *pAVar3;
  RefCntBuffer *pRVar4;
  int i;
  long lVar5;
  int iVar6;
  uint uVar7;
  ulong __n_00;
  
  if (((((((oxcf->rc_cfg).mode - AOM_CBR < 2) || (ppi->use_svc != 0)) ||
        ((oxcf->tile_cfg).enable_large_scale_tile != false)) ||
       (((oxcf->dec_model_cfg).timing_info_present != false || (oxcf->mode != '\0')))) ||
      (((oxcf->tool_cfg).error_resilient_mode != false ||
       (((oxcf->resize_cfg).resize_mode != '\0' || (oxcf->pass != AOM_RC_LAST_PASS)))))) ||
     ((oxcf->max_threads < 2 || (oxcf->fp_mt == false)))) {
    iVar2 = ppi->num_fp_contexts;
    iVar6 = 0;
    if (1 < (long)iVar2) {
      for (lVar5 = 1; iVar2 != lVar5; lVar5 = lVar5 + 1) {
        pAVar3 = ppi->parallel_cpi[lVar5];
        pRVar4 = (pAVar3->common).cur_frame;
        if (pRVar4 != (RefCntBuffer *)0x0) {
          pRVar4->ref_count = pRVar4->ref_count + -1;
          (pAVar3->common).cur_frame = (RefCntBuffer *)0x0;
        }
      }
      bVar1 = ppi->cpi->gf_frame_index;
      uVar7 = (ppi->gf_group).size - (uint)bVar1;
      iVar6 = 0;
      __n_00 = (ulong)uVar7;
      if ((int)uVar7 < 1) {
        __n_00 = 0;
      }
      __n = __n_00 * 4;
      memset((ppi->gf_group).frame_parallel_level + bVar1,0,__n);
      memset((ppi->gf_group).is_frame_non_ref + bVar1,0,__n_00);
      memset((ppi->gf_group).src_offset + bVar1,0,__n);
      memset((ppi->gf_group).skip_frame_refresh + bVar1,0xff,__n_00 << 5);
      memset((ppi->gf_group).skip_frame_as_ref + bVar1,0xff,__n);
      ppi->num_fp_contexts = 1;
    }
  }
  else {
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int av1_check_fpmt_config(AV1_PRIMARY *const ppi,
                          const AV1EncoderConfig *const oxcf) {
  if (is_fpmt_config(ppi, oxcf)) return 1;
  // Reset frame parallel configuration for unsupported config
  if (ppi->num_fp_contexts > 1) {
    for (int i = 1; i < ppi->num_fp_contexts; i++) {
      // Release the previously-used frame-buffer
      if (ppi->parallel_cpi[i]->common.cur_frame != NULL) {
        --ppi->parallel_cpi[i]->common.cur_frame->ref_count;
        ppi->parallel_cpi[i]->common.cur_frame = NULL;
      }
    }

    int cur_gf_index = ppi->cpi->gf_frame_index;
    int reset_size = AOMMAX(0, ppi->gf_group.size - cur_gf_index);
    av1_zero_array(&ppi->gf_group.frame_parallel_level[cur_gf_index],
                   reset_size);
    av1_zero_array(&ppi->gf_group.is_frame_non_ref[cur_gf_index], reset_size);
    av1_zero_array(&ppi->gf_group.src_offset[cur_gf_index], reset_size);
    memset(&ppi->gf_group.skip_frame_refresh[cur_gf_index][0], INVALID_IDX,
           sizeof(ppi->gf_group.skip_frame_refresh[cur_gf_index][0]) *
               reset_size * REF_FRAMES);
    memset(&ppi->gf_group.skip_frame_as_ref[cur_gf_index], INVALID_IDX,
           sizeof(ppi->gf_group.skip_frame_as_ref[cur_gf_index]) * reset_size);
    ppi->num_fp_contexts = 1;
  }
  return 0;
}